

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O1

void __thiscall
Saturation::PredicateSplitPassiveClauseContainer::add
          (PredicateSplitPassiveClauseContainer *this,Clause *cl)

{
  pointer pfVar1;
  __uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  _Var2;
  ulong uVar3;
  long lVar4;
  pointer puVar5;
  uint uVar6;
  HandlerList *pHVar7;
  float extraout_XMM0_Da;
  
  (*(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
    _vptr_ClauseContainer[0x14])();
  pfVar1 = (this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar4 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (extraout_XMM0_Da <= pfVar1[uVar3]) break;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < (ulong)(lVar4 >> 2));
  }
  uVar6 = (uint)uVar3;
  if (this->_layeredArrangement == true) {
    puVar5 = (this->_queues).
             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < (ulong)((long)(this->_queues).
                              super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3)) {
      do {
        uVar6 = uVar6 + 1;
        _Var2._M_t.
        super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
        .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
             puVar5[uVar3]._M_t.
             super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
             ._M_t;
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                              .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var2._M_t.
                   super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                   .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl,
                   cl);
        uVar3 = (ulong)uVar6;
        puVar5 = (this->_queues).
                 super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(this->_queues).
                                     super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3)
              );
    }
  }
  else {
    _Var2._M_t.
    super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
    .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
         (this->_queues).
         super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t.
         super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
         ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                          .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                          _M_head_impl + 0x10))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
               .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl,cl);
  }
  pHVar7 = (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
           super_ClauseContainer.addedEvent.super_BaseEvent._handlers;
  if ((pHVar7 != (HandlerList *)0x0 & (this->super_PassiveClauseContainer)._isOutermost) == 1) {
    do {
      (*pHVar7->_head->_vptr_HandlerStruct[2])(pHVar7->_head,cl);
      pHVar7 = pHVar7->_tail;
    } while (pHVar7 != (List<Lib::BaseEvent::HandlerStruct_*> *)0x0);
  }
  return;
}

Assistant:

void PredicateSplitPassiveClauseContainer::add(Clause* cl)
{
  ASS(cl->store() == Clause::PASSIVE);

  auto bestQueueIndex = bestQueue(evaluateFeature(cl));
  if (_layeredArrangement)
  {
    // add clause to all queues starting from best queue for clause
    for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
    {
      _queues[i]->add(cl);
    }
  }
  else
  {
    // add clause to best queue for clause
    _queues[bestQueueIndex]->add(cl);
  }

  if (_isOutermost)
  {
    addedEvent.fire(cl);
  }

  ASS(cl->store() == Clause::PASSIVE);
}